

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUMagCal.cpp
# Opt level: O0

bool __thiscall RTIMUMagCal::magCalSaveRaw(RTIMUMagCal *this,char *ellipsoidFitPath)

{
  size_t sVar1;
  FILE *__stream;
  RTFLOAT RVar2;
  RTFLOAT RVar3;
  RTFLOAT RVar4;
  RTVector3 RVar5;
  RTFLOAT local_50 [2];
  RTFLOAT local_48;
  undefined1 local_3c [8];
  RTVector3 sample;
  char *rawFile;
  FILE *file;
  char *ellipsoidFitPath_local;
  RTIMUMagCal *this_local;
  
  if (ellipsoidFitPath != (char *)0x0) {
    sVar1 = strlen(ellipsoidFitPath);
    sample.m_data._4_8_ = malloc(sVar1 + 0xc);
    sprintf((char *)sample.m_data._4_8_,"%s/%s",ellipsoidFitPath,"magRaw.dta");
    __stream = fopen((char *)sample.m_data._4_8_,"w");
    if (__stream == (FILE *)0x0) {
      fprintf(_stderr,"Failed to open ellipsoid fit raw data file\n");
      return false;
    }
    while (0 < this->m_magCalCount) {
      RVar5 = removeMagCalData(this);
      local_50 = RVar5.m_data._0_8_;
      local_3c._0_4_ = local_50[0];
      local_3c._4_4_ = local_50[1];
      local_48 = RVar5.m_data[2];
      sample.m_data[0] = local_48;
      RVar2 = RTVector3::x((RTVector3 *)local_3c);
      RVar3 = RTVector3::y((RTVector3 *)local_3c);
      RVar4 = RTVector3::z((RTVector3 *)local_3c);
      fprintf(__stream,"%f %f %f\n",(double)RVar2,(double)RVar3,(double)RVar4);
    }
    fclose(__stream);
  }
  return true;
}

Assistant:

bool RTIMUMagCal::magCalSaveRaw(const char *ellipsoidFitPath)
{
    FILE *file;
    char *rawFile;

    if (ellipsoidFitPath != NULL) {
        // need to deal with ellipsoid fit processing
        rawFile = (char *)malloc(strlen(RTIMUCALDEFS_MAG_RAW_FILE) + strlen(ellipsoidFitPath) + 2);
        sprintf(rawFile, "%s/%s", ellipsoidFitPath, RTIMUCALDEFS_MAG_RAW_FILE);
        if ((file = fopen(rawFile, "w")) == NULL) {
            HAL_ERROR("Failed to open ellipsoid fit raw data file\n");
            return false;
        }
        while (m_magCalCount > 0) {
            RTVector3 sample = removeMagCalData();
            fprintf(file, "%f %f %f\n", sample.x(), sample.y(), sample.z());
        }
        fclose(file);
    }
    return true;
}